

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void colors_modify(char *title,wchar_t row)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  keypress kVar4;
  char *local_68;
  keycode_t kStack_2c;
  keypress cx;
  char index;
  char *name;
  wchar_t i;
  wchar_t row_local;
  char *title_local;
  
  prt("Command: Modify colors",L'\b',L'\0');
  while( true ) {
    clear_from(L'\n');
    for (name._0_4_ = 0; (int)(uint)name < 0x1d; name._0_4_ = (uint)name + 1) {
      Term_putstr((uint)name * 3,L'\x14',L'\xffffffff',(uint)colors_modify::a,"##");
      pcVar2 = format(" %c",(ulong)(uint)(int)color_table[(int)(uint)name].index_char);
      Term_putstr((uint)name * 3,L'\x15',L'\xffffffff',(uint)name & 0xff,pcVar2);
      pcVar2 = format("%2d",(ulong)(uint)name);
      Term_putstr((uint)name * 3,L'\x16',L'\xffffffff',(uint)name & 0xff,pcVar2);
    }
    if (colors_modify::a < 0x1d) {
      local_68 = (char *)((ulong)colors_modify::a * 0x2a + 0x371491);
      cVar1 = color_table[colors_modify::a].index_char;
    }
    else {
      local_68 = "undefined";
      cVar1 = '?';
    }
    pcVar2 = format("Color = %d, Name = %s, Index = %c",(ulong)colors_modify::a,local_68,
                    (ulong)(uint)(int)cVar1);
    Term_putstr(L'\x05',L'\n',L'\xffffffff',L'\x01',pcVar2);
    uVar3 = (ulong)colors_modify::a;
    pcVar2 = format("K = 0x%02x / R,G,B = 0x%02x,0x%02x,0x%02x",(ulong)angband_color_table[uVar3][0]
                    ,(ulong)angband_color_table[uVar3][1],(ulong)angband_color_table[uVar3][2],
                    (ulong)angband_color_table[uVar3][3]);
    Term_putstr(L'\x05',L'\f',L'\xffffffff',L'\x01',pcVar2);
    Term_putstr(L'\0',L'\x0e',L'\xffffffff',L'\x01',"Command (n/N/k/K/r/R/g/G/b/B): ");
    kVar4 = inkey();
    kStack_2c = kVar4.code;
    if (kStack_2c == 0xe000) break;
    if ((kStack_2c == 0x6e) && (colors_modify::a = colors_modify::a + 1, 0x1f < colors_modify::a)) {
      colors_modify::a = '\0';
    }
    if ((kStack_2c == 0x4e) && (colors_modify::a = colors_modify::a - 1, 0x1f < colors_modify::a)) {
      colors_modify::a = '\x1f';
    }
    if (kStack_2c == 0x6b) {
      angband_color_table[colors_modify::a][0] = angband_color_table[colors_modify::a][0] + '\x01';
    }
    if (kStack_2c == 0x4b) {
      angband_color_table[colors_modify::a][0] = angband_color_table[colors_modify::a][0] + 0xff;
    }
    if (kStack_2c == 0x72) {
      angband_color_table[colors_modify::a][1] = angband_color_table[colors_modify::a][1] + '\x01';
    }
    if (kStack_2c == 0x52) {
      angband_color_table[colors_modify::a][1] = angband_color_table[colors_modify::a][1] + 0xff;
    }
    if (kStack_2c == 0x67) {
      angband_color_table[colors_modify::a][2] = angband_color_table[colors_modify::a][2] + '\x01';
    }
    if (kStack_2c == 0x47) {
      angband_color_table[colors_modify::a][2] = angband_color_table[colors_modify::a][2] + 0xff;
    }
    if (kStack_2c == 0x62) {
      angband_color_table[colors_modify::a][3] = angband_color_table[colors_modify::a][3] + '\x01';
    }
    if (kStack_2c == 0x42) {
      angband_color_table[colors_modify::a][3] = angband_color_table[colors_modify::a][3] + 0xff;
    }
    Term_xtra(L'\n',L'\0');
    Term_redraw();
  }
  return;
}

Assistant:

static void colors_modify(const char *title, int row)
{
	int i;

	static uint8_t a = 0;

	/* Prompt */
	prt("Command: Modify colors", 8, 0);

	/* Hack -- query until done */
	while (1) {
		const char *name;
		char index;

		struct keypress cx;

		/* Clear */
		clear_from(10);

		/* Exhibit the normal colors */
		for (i = 0; i < BASIC_COLORS; i++) {
			/* Exhibit this color */
			Term_putstr(i*3, 20, -1, a, "##");

			/* Exhibit character letter */
			Term_putstr(i*3, 21, -1, (uint8_t)i,
						format(" %c", color_table[i].index_char));

			/* Exhibit all colors */
			Term_putstr(i*3, 22, -1, (uint8_t)i, format("%2d", i));
		}

		/* Describe the color */
		name = ((a < BASIC_COLORS) ? color_table[a].name : "undefined");
		index = ((a < BASIC_COLORS) ? color_table[a].index_char : '?');

		/* Describe the color */
		Term_putstr(5, 10, -1, COLOUR_WHITE,
					format("Color = %d, Name = %s, Index = %c",
						   a, name, index));

		/* Label the Current values */
		Term_putstr(5, 12, -1, COLOUR_WHITE,
				format("K = 0x%02x / R,G,B = 0x%02x,0x%02x,0x%02x",
				   angband_color_table[a][0],
				   angband_color_table[a][1],
				   angband_color_table[a][2],
				   angband_color_table[a][3]));

		/* Prompt */
		Term_putstr(0, 14, -1, COLOUR_WHITE,
				"Command (n/N/k/K/r/R/g/G/b/B): ");

		/* Get a command */
		cx = inkey();

		/* All done */
		if (cx.code == ESCAPE) break;

		/* Analyze */
		if (cx.code == 'n') {
			a = (uint8_t)(a + 1);
			if (a >= MAX_COLORS) {
				a = 0;
			}
		}
		if (cx.code == 'N') {
			a = (uint8_t)(a - 1);
			if (a >= MAX_COLORS) {
				a = MAX_COLORS - 1;
			}
		}
		if (cx.code == 'k')
			angband_color_table[a][0] =
				(uint8_t)(angband_color_table[a][0] + 1);
		if (cx.code == 'K')
			angband_color_table[a][0] =
				(uint8_t)(angband_color_table[a][0] - 1);
		if (cx.code == 'r')
			angband_color_table[a][1] =
				(uint8_t)(angband_color_table[a][1] + 1);
		if (cx.code == 'R')
			angband_color_table[a][1] =
				(uint8_t)(angband_color_table[a][1] - 1);
		if (cx.code == 'g')
			angband_color_table[a][2] =
				(uint8_t)(angband_color_table[a][2] + 1);
		if (cx.code == 'G')
			angband_color_table[a][2] =
				(uint8_t)(angband_color_table[a][2] - 1);
		if (cx.code == 'b')
			angband_color_table[a][3] =
				(uint8_t)(angband_color_table[a][3] + 1);
		if (cx.code == 'B')
			angband_color_table[a][3] =
				(uint8_t)(angband_color_table[a][3] - 1);

		/* Hack -- react to changes */
		Term_xtra(TERM_XTRA_REACT, 0);

		/* Hack -- redraw */
		Term_redraw();
	}
}